

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_add_path(plutovg_path_t *path,plutovg_path_t *source,plutovg_matrix_t *matrix)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  plutovg_path_command_t pVar6;
  int iVar7;
  int iVar8;
  plutovg_path_element_t *ppVar9;
  int iVar10;
  long lVar11;
  anon_struct_8_2_c2b912b6_for_header *paVar12;
  int iVar13;
  plutovg_path_element_t *__src;
  plutovg_point_t points [3];
  anon_struct_8_2_c2b912b6_for_header local_58;
  anon_struct_8_2_c2b912b6_for_header local_50;
  float local_48;
  float fStack_44;
  plutovg_matrix_t *local_40;
  anon_struct_8_2_c2b912b6_for_header local_38;
  
  __src = (source->elements).data;
  local_40 = matrix;
  if (matrix == (plutovg_matrix_t *)0x0) {
    if ((__src != (plutovg_path_element_t *)0x0) && (iVar10 = (source->elements).size, 0 < iVar10))
    {
      iVar8 = (path->elements).size;
      iVar13 = (path->elements).capacity;
      if (iVar13 < iVar8 + iVar10) {
        iVar7 = 8;
        if (iVar13 != 0) {
          iVar7 = iVar13;
        }
        do {
          iVar13 = iVar7;
          iVar7 = iVar13 * 2;
        } while (iVar13 < iVar8 + iVar10);
        ppVar9 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar13 << 3);
        (path->elements).data = ppVar9;
        (path->elements).capacity = iVar13;
        iVar8 = (path->elements).size;
        __src = (source->elements).data;
        iVar10 = (source->elements).size;
      }
      else {
        ppVar9 = (path->elements).data;
      }
      memcpy(ppVar9 + iVar8,__src,(long)iVar10 << 3);
      piVar1 = &(path->elements).size;
      *piVar1 = *piVar1 + (source->elements).size;
    }
    path->start_point = source->start_point;
    uVar2 = source->num_points;
    uVar4 = source->num_contours;
    uVar3 = path->num_points;
    uVar5 = path->num_contours;
    path->num_points = uVar3 + uVar2;
    path->num_contours = uVar5 + uVar4;
    path->num_curves = path->num_curves + source->num_curves;
  }
  else {
    iVar10 = (source->elements).size;
    iVar8 = (path->elements).size + iVar10;
    iVar13 = (path->elements).capacity;
    if (iVar13 < iVar8) {
      iVar7 = 8;
      if (iVar13 != 0) {
        iVar7 = iVar13;
      }
      do {
        iVar13 = iVar7;
        iVar7 = iVar13 * 2;
      } while (iVar13 < iVar8);
      ppVar9 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar13 << 3);
      (path->elements).data = ppVar9;
      (path->elements).capacity = iVar13;
    }
    if (0 < iVar10) {
      iVar13 = 0;
      do {
        ppVar9 = __src + iVar13;
        pVar6 = (ppVar9->header).command;
        lVar11 = 8;
        paVar12 = &local_58;
        if ((pVar6 < PLUTOVG_PATH_COMMAND_CUBIC_TO) ||
           (paVar12 = &local_58, pVar6 == PLUTOVG_PATH_COMMAND_CLOSE)) {
LAB_00110bb7:
          *paVar12 = (anon_struct_8_2_c2b912b6_for_header)*(undefined8 *)((long)ppVar9 + lVar11);
        }
        else if (pVar6 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
          local_58 = ppVar9[1].header;
          local_50 = ppVar9[2].header;
          lVar11 = 0x18;
          paVar12 = (anon_struct_8_2_c2b912b6_for_header *)&local_48;
          goto LAB_00110bb7;
        }
        iVar13 = iVar13 + *(int *)((long)ppVar9 + 4);
        switch(pVar6) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
          plutovg_matrix_map_points
                    (local_40,(plutovg_point_t *)&local_58,(plutovg_point_t *)&local_58,1);
          local_38 = local_58;
          ppVar9 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
          ppVar9->header = local_38;
          (path->start_point).x = (float)local_38.command;
          (path->start_point).y = (float)local_38.length;
          path->num_contours = path->num_contours + 1;
          break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
          plutovg_matrix_map_points
                    (local_40,(plutovg_point_t *)&local_58,(plutovg_point_t *)&local_58,1);
          plutovg_path_line_to(path,(float)local_58.command,(float)local_58.length);
          break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
          plutovg_matrix_map_points
                    (local_40,(plutovg_point_t *)&local_58,(plutovg_point_t *)&local_58,3);
          plutovg_path_cubic_to
                    (path,(float)local_58.command,(float)local_58.length,(float)local_50.command,
                     (float)local_50.length,local_48,fStack_44);
          break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
          if ((path->elements).size != 0) {
            ppVar9 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
            *ppVar9 = *(plutovg_path_element_t *)&path->start_point;
          }
        }
      } while (iVar13 < iVar10);
    }
  }
  return;
}

Assistant:

void plutovg_path_add_path(plutovg_path_t* path, const plutovg_path_t* source, const plutovg_matrix_t* matrix)
{
    if(matrix == NULL) {
        plutovg_array_append(path->elements, source->elements);
        path->start_point = source->start_point;
        path->num_points += source->num_points;
        path->num_contours += source->num_contours;
        path->num_curves += source->num_curves;
        return;
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, source);

    plutovg_point_t points[3];
    plutovg_array_ensure(path->elements, source->elements.size);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_move_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_line_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_path_close(path);
            break;
        }
    }
}